

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O3

ssize_t __thiscall
Liby::UdpConnection::send(UdpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  _Head_base<0UL,_std::function<void_()>_*,_false> this_00;
  UdpSocket *pUVar1;
  UdpSocket *extraout_RAX;
  UdpSocket *extraout_RAX_00;
  undefined4 in_register_00000034;
  bool bVar2;
  undefined1 local_59;
  undefined1 local_58 [24];
  _Head_base<0UL,_std::function<void_()>_*,_false> local_40;
  void *local_38;
  char *local_30;
  Buffer *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_30 = (char *)CONCAT44(in_register_00000034,__fd);
  local_38 = __buf;
  if (this->socket_ != (UdpSocket *)0x0) {
    local_58._8_8_ = (element_type *)0x0;
    local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40._M_head_impl = (function<void_()> *)0x0;
    local_28 = (Buffer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Buffer,std::allocator<Liby::Buffer>,char_const*&,long&>
              (&_Stack_20,&local_28,(allocator<Liby::Buffer> *)&local_59,&local_30,(long *)&local_38
              );
    local_58._8_8_ = local_28;
    local_58._16_8_ = _Stack_20._M_pi;
    local_58._0_8_ = &this->peer_;
    if (*(long *)(__n + 0x10) != 0) {
      this_00._M_head_impl = (function<void_()> *)operator_new(0x20);
      std::function<void_()>::function(this_00._M_head_impl,(function<void_()> *)__n);
      __ptr._M_head_impl = local_40._M_head_impl;
      bVar2 = local_40._M_head_impl != (function<void_()> *)0x0;
      local_40._M_head_impl = this_00._M_head_impl;
      if (bVar2) {
        std::default_delete<std::function<void_()>_>::operator()
                  ((default_delete<std::function<void_()>_> *)&local_40,__ptr._M_head_impl);
      }
    }
    pUVar1 = this->socket_;
    std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::
    emplace_back<Liby::udp_io_task>(&pUVar1->writTasks_,(udp_io_task *)local_58);
    pUVar1 = UdpSocket::enableWrit(pUVar1,true);
    if (local_40._M_head_impl != (function<void_()> *)0x0) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_40,local_40._M_head_impl);
      pUVar1 = extraout_RAX;
    }
    local_40._M_head_impl = (function<void_()> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._16_8_);
      pUVar1 = extraout_RAX_00;
    }
    return (ssize_t)pUVar1;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,8,"void Liby::UdpConnection::send(const char *, off_t, const BasicHandler &)");
}

Assistant:

void UdpConnection::send(const char *base, off_t len,
                         const BasicHandler &handler) {
    assert(socket_);
    udp_io_task utask;
    utask.buffer_ = std::make_shared<Buffer>(base, len);
    utask.dest_ = &peer_;
    if (handler) {
        utask.handler_ = std::make_unique<BasicHandler>(handler);
    }
    socket_->send(std::move(utask));
}